

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O3

void __thiscall Vector<int>::operator=(Vector<int> *this,Vector<int> *other)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = this->N;
  if (iVar2 != other->N) {
    iVar2 = other->N;
    if (this->values != (int *)0x0) {
      operator_delete__(this->values);
      iVar2 = other->N;
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = (long)iVar2 * 4;
    }
    piVar3 = (int *)operator_new__(uVar5);
    this->values = piVar3;
    this->N = iVar2;
  }
  if (0 < iVar2) {
    piVar3 = other->values;
    piVar1 = this->values;
    lVar4 = 0;
    do {
      piVar1[lVar4] = piVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->N);
  }
  return;
}

Assistant:

void operator=(const Vector& other)
    {
        if(N != other.N)
        {
            delete[](values);
            values = new T[other.N];
            N = other.N;
        }
        for(int i=0; i<N; ++i)
            values[i] = other.values[i];
    }